

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

CAmount wallet::GenerateChangeTarget
                  (CAmount payment_value,CAmount change_fee,FastRandomContext *rng)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (25000 < payment_value) {
    uVar4 = payment_value * 2;
    if (999999 < uVar4) {
      uVar4 = 1000000;
    }
    uVar4 = uVar4 - 0xc351;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    do {
      uVar3 = RandomMixin<FastRandomContext>::randbits
                        (&rng->super_RandomMixin<FastRandomContext>,
                         ((uint)lVar2 ^ 0xffffffc0) + 0x41);
    } while (uVar4 < uVar3);
    change_fee = change_fee + uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return change_fee + 50000;
  }
  __stack_chk_fail();
}

Assistant:

CAmount GenerateChangeTarget(const CAmount payment_value, const CAmount change_fee, FastRandomContext& rng)
{
    if (payment_value <= CHANGE_LOWER / 2) {
        return change_fee + CHANGE_LOWER;
    } else {
        // random value between 50ksat and min (payment_value * 2, 1milsat)
        const auto upper_bound = std::min(payment_value * 2, CHANGE_UPPER);
        return change_fee + rng.randrange(upper_bound - CHANGE_LOWER) + CHANGE_LOWER;
    }
}